

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O1

void analyze_C_declarations(void *userdata,char *key,int keylen,void *val)

{
  undefined8 *puVar1;
  int iVar2;
  C_Type *ty;
  
  iVar2 = is_builtin(key,keylen);
  if (iVar2 == 0) {
    if (*(int *)((long)userdata + 0x14) != 0) {
LAB_0011ef67:
      analyze_C_types((C_Decl_Analysis *)userdata,(C_Type *)val);
      return;
    }
    if (*val == 0) {
      val = *(void **)((long)val + 8);
      if ((C_Type *)val != (C_Type *)0x0) goto LAB_0011ef67;
    }
    else {
      puVar1 = *(undefined8 **)((long)userdata + 0x18);
      (*(code *)puVar1[0xc])(*puVar1,"Declaring objects is not allowed: ");
      (*(code *)puVar1[0xc])(*puVar1,*(undefined8 *)(*val + 8));
      *(int *)((long)userdata + 0x10) = *(int *)((long)userdata + 0x10) + -1;
    }
  }
  return;
}

Assistant:

static void analyze_C_declarations(void *userdata, char *key, int keylen, void *val)
{
	C_Decl_Analysis *analysis = (C_Decl_Analysis *)userdata;
	if (is_builtin(key, keylen))
		return;
	if (analysis->is_tags) {
		C_Type *ty = val;
		analyze_C_types(analysis, ty);
	} else {
		C_VarScope *vc = val;
		analyze_C_vars(analysis, vc);
	}
}